

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O3

RABlock * __thiscall
asmjit::ZoneStack<asmjit::RABlock_*>::popFirst(ZoneStack<asmjit::RABlock_*> *this)

{
  String *pSVar1;
  Block *pBVar2;
  uint *puVar3;
  Error EVar4;
  RABlock *extraout_RAX;
  RABlock *pRVar5;
  undefined4 extraout_var;
  uint *puVar6;
  undefined4 extraout_var_00;
  ulong *in_RCX;
  uint uVar7;
  ulong uVar8;
  ulong *extraout_RDX;
  uint *puVar9;
  uint *puVar10;
  char c;
  ZoneAllocator *in_RSI;
  uint *puVar11;
  String *this_00;
  uint *in_R8;
  uint uVar12;
  uint *puVar13;
  
  if ((this->super_ZoneStackBase)._allocator == (ZoneAllocator *)0x0) {
    ZoneStack<asmjit::RABlock*>::popFirst();
LAB_00121972:
    ZoneStack<asmjit::RABlock*>::popFirst();
  }
  else {
    pBVar2 = (this->super_ZoneStackBase)._block[0];
    in_RCX = (ulong *)pBVar2->_start;
    if (in_RCX == (ulong *)(this->super_ZoneStackBase)._block[1]->_end) goto LAB_00121972;
    if (in_RCX != (ulong *)pBVar2->_end) {
      pRVar5 = (RABlock *)*in_RCX;
      pBVar2->_start = in_RCX + 1;
      if (in_RCX + 1 == (ulong *)pBVar2->_end) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
      }
      return pRVar5;
    }
  }
  ZoneStack<asmjit::RABlock*>::popFirst();
  if ((uint)in_RSI < ((ZoneVectorBase *)((long)this + 0x140))->_size) {
    return (RABlock *)
           ((Block *)((ZoneVectorBase *)((long)this + 0x140))->_data)->_link
           [(ulong)in_RSI & 0xffffffff];
  }
  BaseRAPass::workRegById();
  if (in_RSI < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return (RABlock *)
           (((ZoneStackBase *)&((ZoneVectorBase *)this)->_data)->_allocator->_slots +
           (long)((long)&in_RSI[-1]._dynamicBlocks + 7));
  }
  ZoneVector<asmjit::RAWorkReg*>::operator[]();
  pRVar5 = (RABlock *)((ZoneStackBase *)&((ZoneVectorBase *)this)->_data)->_allocator;
  if (pRVar5 == (RABlock *)0x0) {
    return (RABlock *)0x0;
  }
  if (in_RSI->_zone == (Zone *)0x0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar7 = ((ZoneVectorBase *)this)->_capacity << 2;
    uVar8 = (ulong)uVar7;
    if (uVar8 != 0) {
      if (uVar7 < 0x201) {
        if (uVar7 < 0x81) {
          uVar8 = uVar8 + 0x1fffffffff >> 5;
        }
        else {
          uVar8 = (uVar8 + 0x3fffffff7f >> 6) + 4;
        }
        pRVar5->_ra = (BaseRAPass *)in_RSI->_slots[uVar8 & 0xffffffff];
        in_RSI->_slots[uVar8 & 0xffffffff] = (Slot *)pRVar5;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar5,uVar8);
        pRVar5 = extraout_RAX;
      }
      ((ZoneStackBase *)&((ZoneVectorBase *)this)->_data)->_allocator = (ZoneAllocator *)0x0;
      *(Block **)&((ZoneVectorBase *)this)->_size = (Block *)0x0;
      return pRVar5;
    }
  }
  ZoneVector<unsigned_int>::release();
  uVar7 = (uint)extraout_RDX[1];
  uVar12 = (uint)in_RCX[1];
  if (((ZoneVectorBase *)this)->_capacity < uVar12 + uVar7) {
    EVar4 = ZoneVectorBase::_reserve((ZoneVectorBase *)this,in_RSI,0xc,uVar12 + uVar7);
    if (EVar4 != 0) {
      return (RABlock *)CONCAT44(extraout_var,EVar4);
    }
    uVar7 = (uint)extraout_RDX[1];
    uVar12 = (uint)in_RCX[1];
  }
  puVar3 = (uint *)((ZoneVectorBase *)this)->_data;
  this_00 = (String *)*extraout_RDX;
  puVar10 = (uint *)*in_RCX;
  pSVar1 = (String *)((long)&this_00->field_0 + (ulong)uVar7 * 0xc);
  puVar11 = puVar10 + (ulong)uVar12 * 3;
  puVar6 = puVar3;
  if (uVar12 != 0 && uVar7 != 0) {
    uVar7 = *(uint *)&this_00->field_0;
    puVar9 = puVar10;
    puVar13 = puVar3;
    do {
      while (uVar12 = puVar9[1], uVar7 < uVar12) {
        uVar7 = *puVar9;
        while (uVar12 = *(uint *)((long)&this_00->field_0 + 4), uVar12 <= uVar7) {
          puVar6 = puVar13 + 3;
          *puVar13 = *(uint *)&this_00->field_0;
          puVar13[1] = uVar12;
          puVar13[2] = *(uint *)((long)&this_00->field_0 + 8);
          this_00 = (String *)((long)&this_00->field_0 + 0xc);
          puVar10 = puVar9;
          puVar13 = puVar6;
          if (this_00 == pSVar1) goto LAB_00121b3f;
        }
        uVar7 = *(uint *)&this_00->field_0;
        if (uVar7 < puVar9[1]) {
          return (RABlock *)0xffffffff;
        }
      }
      *puVar13 = *puVar9;
      puVar13[1] = uVar12;
      puVar13[2] = *in_R8;
      puVar13 = puVar13 + 3;
      puVar9 = puVar9 + 3;
      puVar10 = puVar11;
      puVar6 = puVar13;
    } while (puVar9 != puVar11);
  }
  for (; this_00 != pSVar1; this_00 = (String *)((long)&this_00->field_0 + 0xc)) {
    *(undefined8 *)puVar6 = *(undefined8 *)&this_00->field_0;
    puVar6[2] = *(uint *)((long)&this_00->field_0 + 8);
    puVar6 = puVar6 + 3;
  }
LAB_00121b3f:
  if (puVar10 != puVar11) {
    uVar7 = *in_R8;
    this_00 = (String *)(ulong)uVar7;
    do {
      *(undefined8 *)puVar6 = *(undefined8 *)puVar10;
      puVar6[2] = uVar7;
      puVar6 = puVar6 + 3;
      puVar10 = puVar10 + 3;
    } while (puVar10 != puVar11);
  }
  if (puVar3 <= puVar6) {
    puVar11 = puVar3 + (ulong)((ZoneVectorBase *)this)->_capacity * 3;
    if (puVar6 <= puVar11) {
      uVar7 = (int)((ulong)((long)puVar6 - (long)puVar3) >> 2) * -0x55555555;
      if (uVar7 <= ((ZoneVectorBase *)this)->_capacity) {
        ((ZoneVectorBase *)this)->_size = uVar7;
        return (RABlock *)0x0;
      }
      goto LAB_00121b96;
    }
  }
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
LAB_00121b96:
  c = (char)puVar11;
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
  EVar4 = String::_opChar(this_00,1,c);
  return (RABlock *)CONCAT44(extraout_var_00,EVar4);
}

Assistant:

inline bool isInitialized() const noexcept { return _allocator != nullptr; }